

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall cmTarget::PushTLLCommandTrace(cmTarget *this,TLLSignature signature)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  cmListFileContext lfc;
  TLLSignature local_ac;
  cmListFileContext local_a8;
  pair<cmTarget::TLLSignature,_cmListFileContext> local_60;
  
  ppVar1 = (this->TLLCommands).
           super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->TLLCommands).
      super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
      ._M_impl.super__Vector_impl_data._M_start == ppVar1) {
    bVar3 = true;
  }
  else {
    bVar3 = ppVar1[-1].first == signature;
  }
  local_ac = signature;
  cmMakefile::GetExecutionContext(&local_a8,this->Makefile);
  ppVar1 = (this->TLLCommands).
           super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->TLLCommands).
      super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
      ._M_impl.super__Vector_impl_data._M_start != ppVar1) {
    bVar2 = operator!=(&ppVar1[-1].second,&local_a8);
    if (!bVar2) goto LAB_0029db00;
  }
  std::pair<cmTarget::TLLSignature,_cmListFileContext>::
  pair<cmTarget::TLLSignature_&,_cmListFileContext_&,_true>(&local_60,&local_ac,&local_a8);
  std::
  vector<std::pair<cmTarget::TLLSignature,cmListFileContext>,std::allocator<std::pair<cmTarget::TLLSignature,cmListFileContext>>>
  ::emplace_back<std::pair<cmTarget::TLLSignature,cmListFileContext>>
            ((vector<std::pair<cmTarget::TLLSignature,cmListFileContext>,std::allocator<std::pair<cmTarget::TLLSignature,cmListFileContext>>>
              *)&this->TLLCommands,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.second.FilePath._M_dataplus._M_p != &local_60.second.FilePath.field_2) {
    operator_delete(local_60.second.FilePath._M_dataplus._M_p,
                    local_60.second.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.second.Name._M_dataplus._M_p != &local_60.second.Name.field_2) {
    operator_delete(local_60.second.Name._M_dataplus._M_p,
                    local_60.second.Name.field_2._M_allocated_capacity + 1);
  }
LAB_0029db00:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.FilePath._M_dataplus._M_p != &local_a8.FilePath.field_2) {
    operator_delete(local_a8.FilePath._M_dataplus._M_p,
                    local_a8.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.Name._M_dataplus._M_p != &local_a8.Name.field_2) {
    operator_delete(local_a8.Name._M_dataplus._M_p,local_a8.Name.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmTarget::PushTLLCommandTrace(TLLSignature signature)
{
  bool ret = true;
  if (!this->TLLCommands.empty())
    {
    if (this->TLLCommands.back().first != signature)
      {
      ret = false;
      }
    }
  cmListFileContext lfc = this->Makefile->GetExecutionContext();
  if (this->TLLCommands.empty() || this->TLLCommands.back().second != lfc)
    {
    this->TLLCommands.push_back(std::make_pair(signature, lfc));
    }
  return ret;
}